

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QSize __thiscall QToolBarAreaLayoutLine::minimumSize(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem *pQVar1;
  QLayoutItem *pQVar2;
  int iVar3;
  QSize QVar4;
  uint uVar5;
  Representation RVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((this->toolBarItems).d.size == 0) {
    uVar5 = 0;
    uVar9 = 0;
  }
  else {
    lVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar5 = 0;
    do {
      pQVar1 = (this->toolBarItems).d.ptr;
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar7);
      RVar6.m_i = uVar5;
      if (((&pQVar1->gap)[lVar7] != false) ||
         ((pQVar2 = this_00->widgetItem, pQVar2 != (QLayoutItem *)0x0 &&
          (iVar3 = (*pQVar2->_vptr_QLayoutItem[8])(), (char)iVar3 == '\0')))) {
        QVar4 = QToolBarAreaLayoutItem::minimumSize(this_00);
        RVar6.m_i = QVar4.ht.m_i.m_i;
        if (this->o == Horizontal) {
          RVar6.m_i = QVar4.wd.m_i.m_i;
        }
        uVar9 = uVar9 + RVar6.m_i;
        RVar6.m_i = QVar4.ht.m_i.m_i;
        if (this->o == Vertical) {
          RVar6.m_i = QVar4.wd.m_i.m_i;
        }
        if (RVar6.m_i < (int)uVar5) {
          RVar6.m_i = uVar5;
        }
      }
      uVar5 = RVar6.m_i;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < (ulong)(this->toolBarItems).d.size);
  }
  if (this->o == Horizontal) {
    uVar8 = (ulong)uVar5;
  }
  else if (this->o == Vertical) {
    uVar8 = (ulong)uVar9;
    uVar9 = uVar5;
  }
  else {
    uVar8 = (ulong)uVar5;
    uVar9 = 0xffffffff;
  }
  return (QSize)((ulong)uVar9 | uVar8 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutLine::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        QSize ms = item.minimumSize();
        a += pick(o, ms);
        b = qMax(b, perp(o, ms));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}